

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserPafTest_CompressedParseWhole_Test::TestBody
          (BioparserPafTest_CompressedParseWhole_Test *this)

{
  pointer pPVar1;
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  local_60;
  allocator local_31;
  string local_30;
  BioparserPafTest_CompressedParseWhole_Test *local_10;
  BioparserPafTest_CompressedParseWhole_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sample.paf.gz",&local_31);
  BioparserPafTest::Setup(&this->super_BioparserPafTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = std::
           unique_ptr<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
           ::operator->(&(this->super_BioparserPafTest).p);
  (*pPVar1->_vptr_Parser[2])(&local_60,pPVar1,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ::operator=(&(this->super_BioparserPafTest).o,&local_60);
  std::
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ::~vector(&local_60);
  BioparserPafTest::Check(&this->super_BioparserPafTest);
  return;
}

Assistant:

TEST_F(BioparserPafTest, CompressedParseWhole) {
  Setup("sample.paf.gz");
  o = p->Parse(-1);
  Check();
}